

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

string * ot::commissioner::StripComments(string *__return_storage_ptr__,string *aStr)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char local_61;
  int nextc;
  int c;
  size_t i;
  bool inBlockComment;
  bool inInlineComment;
  string *aStr_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar3 = false;
  bVar2 = false;
  _nextc = 0;
  while (uVar4 = std::__cxx11::string::size(), _nextc < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)aStr);
    cVar1 = *pcVar5;
    uVar4 = std::__cxx11::string::size();
    if (_nextc + 1 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)aStr);
      local_61 = *pcVar5;
    }
    else {
      local_61 = '\0';
    }
    if (bVar2) {
      if ((cVar1 == '*') && (local_61 == '/')) {
        bVar2 = false;
        _nextc = _nextc + 2;
      }
      else {
        _nextc = _nextc + 1;
      }
    }
    else if (bVar3) {
      if ((cVar1 == '\r') && (local_61 == '\n')) {
        bVar3 = false;
        _nextc = _nextc + 2;
      }
      else {
        if (cVar1 == '\n') {
          bVar3 = false;
        }
        _nextc = _nextc + 1;
      }
    }
    else if ((cVar1 == '/') && (local_61 == '*')) {
      bVar2 = true;
      _nextc = _nextc + 2;
    }
    else if ((cVar1 == '/') && (local_61 == '/')) {
      bVar3 = true;
      _nextc = _nextc + 2;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      _nextc = _nextc + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string StripComments(const std::string &aStr)
{
    std::string ret;
    bool        inInlineComment = false;
    bool        inBlockComment  = false;

    for (size_t i = 0; i < aStr.size();)
    {
        int c     = aStr[i];
        int nextc = i + 1 < aStr.size() ? aStr[i + 1] : '\0';

        if (inBlockComment)
        {
            if (c == '*' && nextc == '/')
            {
                inBlockComment = false;
                i += 2;
            }
            else
            {
                ++i;
            }
        }
        else if (inInlineComment)
        {
            if (c == '\r' && nextc == '\n')
            {
                inInlineComment = false;
                i += 2;
            }
            else if (c == '\n')
            {
                inInlineComment = false;
                ++i;
            }
            else
            {
                ++i;
            }
        }
        else
        {
            if (c == '/' && nextc == '*')
            {
                inBlockComment = true;
                i += 2;
            }
            else if (c == '/' && nextc == '/')
            {
                inInlineComment = true;
                i += 2;
            }
            else
            {
                ret.push_back(c);
                ++i;
            }
        }
    }

    return ret;
}